

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O2

TestCaseGroup * vkt::tessellation::createGeometryGridRenderLimitsTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  GridRenderTestCase *this;
  long lVar2;
  allocator<char> local_8a;
  allocator<char> local_89;
  TestContext *local_88;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  string local_70;
  string local_50;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  local_88 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,testCtx,"limits","Render with properties near their limits");
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar1;
  for (lVar2 = 0x10;
      pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr, lVar2 != 0x58; lVar2 = lVar2 + 0x18) {
    this = (GridRenderTestCase *)operator_new(0x88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,*(char **)((long)&PTR_typeinfo_name_00c094c0 + lVar2),&local_89);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,*(char **)((long)&PTR_typeinfo_00c094c8 + lVar2),&local_8a);
    anon_unknown_1::GridRenderTestCase::GridRenderTestCase
              (this,local_88,&local_70,&local_50,
               *(Flags *)((long)&createGeometryGridRenderLimitsTests::cases[0].name + lVar2));
    tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)this);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createGeometryGridRenderLimitsTests  (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "limits", "Render with properties near their limits"));

	static const TestCaseDescription cases[] =
	{
		{
			"output_required_max_tessellation",
			"Minimum maximum tessellation level",
			FLAG_TESSELLATION_MAX_SPEC
		},
		{
			"output_required_max_geometry",
			"Output minimum maximum number of vertices the geometry shader",
			FLAG_GEOMETRY_MAX_SPEC
		},
		{
			"output_required_max_invocations",
			"Minimum maximum number of geometry shader invocations",
			FLAG_GEOMETRY_INVOCATIONS_MAX_SPEC
		},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ++ndx)
		group->addChild(new GridRenderTestCase(testCtx, cases[ndx].name, cases[ndx].desc, cases[ndx].flags));

	return group.release();
}